

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3tokConnectMethod
              (sqlite3 *db,void *pHash,int argc,char **argv,sqlite3_vtab **ppVtab,char **pzErr)

{
  int iVar1;
  size_t sVar2;
  undefined8 *p;
  Fts3HashElem *pFVar3;
  sqlite3_vtab *psVar4;
  char **ppcVar5;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int extraout_EDX_06;
  ulong uVar6;
  char *pcVar7;
  sqlite3 *psVar8;
  sqlite3_vtab **ppsVar9;
  char **ppcVar10;
  uint uVar11;
  char *pcVar12;
  sqlite3_module *psVar13;
  int iVar14;
  sqlite3_tokenizer *pTok;
  sqlite3 *local_50;
  ulong local_48;
  char **local_40;
  Fts3Hash *local_38;
  
  local_50 = (sqlite3 *)0x0;
  pcVar7 = "CREATE TABLE x(input, token, start, end, position)";
  ppcVar5 = argv;
  ppsVar9 = ppVtab;
  ppcVar10 = pzErr;
  iVar1 = sqlite3_declare_vtab(db,"CREATE TABLE x(input, token, start, end, position)");
  if (iVar1 == 0) {
    uVar11 = argc - 3;
    local_40 = pzErr;
    local_38 = (Fts3Hash *)pHash;
    if (uVar11 == 0) {
      p = (undefined8 *)0x0;
      iVar1 = 0;
      iVar14 = extraout_EDX;
    }
    else {
      iVar1 = 0;
      iVar14 = 0;
      local_48 = (ulong)(uint)argc;
      if (3 < argc) {
        uVar6 = 0;
        iVar14 = 0;
        do {
          sVar2 = strlen(argv[uVar6 + 3]);
          iVar14 = iVar14 + (int)sVar2 + 1;
          uVar6 = uVar6 + 1;
        } while (uVar11 != uVar6);
      }
      p = (undefined8 *)sqlite3_malloc(iVar14 + uVar11 * 8);
      if (p == (undefined8 *)0x0) {
        iVar1 = 7;
      }
      argc = (int)local_48;
      iVar14 = extraout_EDX_00;
      if ((3 < argc) && (p != (undefined8 *)0x0)) {
        pcVar12 = (char *)(p + uVar11);
        uVar6 = 0;
        do {
          sVar2 = strlen(argv[uVar6 + 3]);
          p[uVar6] = pcVar12;
          pcVar7 = argv[uVar6 + 3];
          sVar2 = (size_t)((int)sVar2 + 1);
          memcpy(pcVar12,pcVar7,sVar2);
          sqlite3Fts3Dequote(pcVar12);
          pcVar12 = pcVar12 + sVar2;
          uVar6 = uVar6 + 1;
        } while (uVar11 != uVar6);
        iVar1 = 0;
        argc = (int)local_48;
        iVar14 = extraout_EDX_01;
      }
    }
    if (iVar1 == 0) {
      if (argc < 4) {
        pcVar12 = "simple";
      }
      else {
        pcVar12 = (char *)*p;
      }
      sVar2 = strlen(pcVar12);
      pcVar7 = pcVar12;
      pFVar3 = sqlite3Fts3HashFindElem(local_38,pcVar12,(int)sVar2 + 1);
      iVar1 = 0;
      if (pFVar3 == (Fts3HashElem *)0x0) {
        psVar13 = (sqlite3_module *)0x0;
      }
      else {
        psVar13 = (sqlite3_module *)pFVar3->data;
      }
      iVar14 = extraout_EDX_02;
      if (psVar13 == (sqlite3_module *)0x0) {
        psVar13 = (sqlite3_module *)0x0;
        pcVar7 = sqlite3_mprintf("unknown tokenizer: %s");
        *local_40 = pcVar7;
        iVar1 = 1;
        ppcVar5 = local_40;
        pcVar7 = pcVar12;
        iVar14 = extraout_EDX_03;
      }
    }
    else {
      psVar13 = (sqlite3_module *)0x0;
    }
    if (iVar1 == 0) {
      pcVar7 = (char *)(p + 1);
      psVar8 = (sqlite3 *)0x0;
      if (4 < argc) {
        psVar8 = (sqlite3 *)(ulong)(argc - 4);
      }
      iVar1 = (*psVar13->xCreate)(psVar8,pcVar7,(int)&local_50,ppcVar5,ppsVar9,ppcVar10);
      iVar14 = extraout_EDX_04;
    }
    if (iVar1 == 0) {
      iVar14 = sqlite3_initialize();
      iVar1 = 0;
      if (iVar14 == 0) {
        psVar4 = (sqlite3_vtab *)sqlite3Malloc(0x28);
        iVar14 = extraout_EDX_06;
      }
      else {
        psVar4 = (sqlite3_vtab *)0x0;
        iVar14 = extraout_EDX_05;
      }
      ppcVar5 = (char **)0x7;
      if (psVar4 == (sqlite3_vtab *)0x0) {
        iVar1 = 7;
      }
    }
    else {
      psVar4 = (sqlite3_vtab *)0x0;
    }
    if (iVar1 == 0) {
      psVar4->zErrMsg = (char *)0x0;
      psVar4[1].pModule = (sqlite3_module *)0x0;
      psVar4->pModule = (sqlite3_module *)0x0;
      *(undefined8 *)&psVar4->nRef = 0;
      *(undefined8 *)&psVar4[1].nRef = 0;
      psVar4[1].pModule = psVar13;
      *(sqlite3 **)&psVar4[1].nRef = local_50;
      *ppVtab = psVar4;
    }
    else if (local_50 != (sqlite3 *)0x0) {
      (*psVar13->xConnect)(local_50,pcVar7,iVar14,ppcVar5,ppsVar9,ppcVar10);
    }
    sqlite3_free(p);
  }
  return iVar1;
}

Assistant:

static int fts3tokConnectMethod(
  sqlite3 *db,                    /* Database connection */
  void *pHash,                    /* Hash table of tokenizers */
  int argc,                       /* Number of elements in argv array */
  const char * const *argv,       /* xCreate/xConnect argument array */
  sqlite3_vtab **ppVtab,          /* OUT: New sqlite3_vtab object */
  char **pzErr                    /* OUT: sqlite3_malloc'd error message */
){
  Fts3tokTable *pTab = 0;
  const sqlite3_tokenizer_module *pMod = 0;
  sqlite3_tokenizer *pTok = 0;
  int rc;
  char **azDequote = 0;
  int nDequote;

  rc = sqlite3_declare_vtab(db, FTS3_TOK_SCHEMA);
  if( rc!=SQLITE_OK ) return rc;

  nDequote = argc-3;
  rc = fts3tokDequoteArray(nDequote, &argv[3], &azDequote);

  if( rc==SQLITE_OK ){
    const char *zModule;
    if( nDequote<1 ){
      zModule = "simple";
    }else{
      zModule = azDequote[0];
    }
    rc = fts3tokQueryTokenizer((Fts3Hash*)pHash, zModule, &pMod, pzErr);
  }

  assert( (rc==SQLITE_OK)==(pMod!=0) );
  if( rc==SQLITE_OK ){
    const char * const *azArg = (const char * const *)&azDequote[1];
    rc = pMod->xCreate((nDequote>1 ? nDequote-1 : 0), azArg, &pTok);
  }

  if( rc==SQLITE_OK ){
    pTab = (Fts3tokTable *)sqlite3_malloc(sizeof(Fts3tokTable));
    if( pTab==0 ){
      rc = SQLITE_NOMEM;
    }
  }

  if( rc==SQLITE_OK ){
    memset(pTab, 0, sizeof(Fts3tokTable));
    pTab->pMod = pMod;
    pTab->pTok = pTok;
    *ppVtab = &pTab->base;
  }else{
    if( pTok ){
      pMod->xDestroy(pTok);
    }
  }

  sqlite3_free(azDequote);
  return rc;
}